

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O1

int Vec_PtrPushUnique(Vec_Ptr_t *p,void *Entry)

{
  uint uVar1;
  void **ppvVar2;
  void **ppvVar3;
  int iVar4;
  
  ppvVar2 = (void **)(long)p->nSize;
  if (0 < (long)ppvVar2) {
    ppvVar3 = (void **)0x0;
    do {
      if (p->pArray[(long)ppvVar3] == Entry) goto LAB_007916d6;
      ppvVar3 = (void **)((long)ppvVar3 + 1);
    } while (ppvVar2 != ppvVar3);
  }
  uVar1 = p->nCap;
  if (p->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(p->pArray,0x80);
      }
      p->pArray = ppvVar2;
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar1 * 2;
      if (iVar4 <= (int)uVar1) goto LAB_007916c3;
      if (p->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(p->pArray,(ulong)uVar1 << 4);
      }
      p->pArray = ppvVar2;
    }
    p->nCap = iVar4;
  }
LAB_007916c3:
  ppvVar2 = p->pArray;
  iVar4 = p->nSize;
  p->nSize = iVar4 + 1;
  ppvVar2[iVar4] = Entry;
LAB_007916d6:
  return (int)ppvVar2;
}

Assistant:

static inline int Vec_PtrPushUnique( Vec_Ptr_t * p, void * Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return 1;
    Vec_PtrPush( p, Entry );
    return 0;
}